

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_GetBitcoinAddressFormatList_Test::TestBody(Address_GetBitcoinAddressFormatList_Test *this)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  AssertHelper local_78;
  Message local_70 [3];
  string local_58;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> list;
  Address_GetBitcoinAddressFormatList_Test *this_local;
  
  cfd::core::GetBitcoinAddressFormatList();
  this_00 = std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ::operator[]((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)&gtest_ar.message_,0);
  cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_58,this_00);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_38,"\"bc\"","list[NetType::kMainnet].GetBech32Hrp().c_str()","bc",
             pcVar2);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar.message_);
  return;
}

Assistant:

TEST(Address, GetBitcoinAddressFormatList) {
  std::vector<AddressFormatData> list = GetBitcoinAddressFormatList();
  EXPECT_STREQ("bc", list[NetType::kMainnet].GetBech32Hrp().c_str());
}